

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void SobelToPlaneRow_C(uint8_t *src_sobelx,uint8_t *src_sobely,uint8_t *dst_y,int width)

{
  int32_t iVar1;
  int in_ECX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  long in_RSI;
  long in_RDI;
  int s;
  int b;
  int r;
  int i;
  undefined4 local_20;
  
  for (local_20 = 0; local_20 < in_ECX; local_20 = local_20 + 1) {
    iVar1 = libyuv::clamp255((uint)*(byte *)(in_RDI + local_20) + (uint)*(byte *)(in_RSI + local_20)
                            );
    *(char *)(CONCAT71(in_register_00000011,in_DL) + (long)local_20) = (char)iVar1;
  }
  return;
}

Assistant:

void SobelToPlaneRow_C(const uint8_t* src_sobelx,
                       const uint8_t* src_sobely,
                       uint8_t* dst_y,
                       int width) {
  int i;
  for (i = 0; i < width; ++i) {
    int r = src_sobelx[i];
    int b = src_sobely[i];
    int s = clamp255(r + b);
    dst_y[i] = (uint8_t)(s);
  }
}